

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O0

void __thiscall Catch::TeamCityReporter::printSectionHeader(TeamCityReporter *this,ostream *os)

{
  bool bVar1;
  size_type sVar2;
  ostream *poVar3;
  pointer _string;
  reference pvVar4;
  lineOfChars local_61;
  undefined1 local_60 [8];
  SourceLineInfo lineInfo;
  __normal_iterator<Catch::SectionInfo_*,_std::vector<Catch::SectionInfo,_std::allocator<Catch::SectionInfo>_>_>
  local_48;
  __normal_iterator<const_Catch::SectionInfo_*,_std::vector<Catch::SectionInfo,_std::allocator<Catch::SectionInfo>_>_>
  local_40;
  const_iterator itEnd;
  __normal_iterator<Catch::SectionInfo_*,_std::vector<Catch::SectionInfo,_std::allocator<Catch::SectionInfo>_>_>
  local_30;
  __normal_iterator<const_Catch::SectionInfo_*,_std::vector<Catch::SectionInfo,_std::allocator<Catch::SectionInfo>_>_>
  local_28;
  const_iterator it;
  ostream *os_local;
  TeamCityReporter *this_local;
  
  bVar1 = std::vector<Catch::SectionInfo,_std::allocator<Catch::SectionInfo>_>::empty
                    (&(this->super_StreamingReporterBase).m_sectionStack);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    __assert_fail("!m_sectionStack.empty()",
                  "/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/test/catch_amalgamated.cpp"
                  ,0x28d6,"void Catch::TeamCityReporter::printSectionHeader(std::ostream &)");
  }
  sVar2 = std::vector<Catch::SectionInfo,_std::allocator<Catch::SectionInfo>_>::size
                    (&(this->super_StreamingReporterBase).m_sectionStack);
  if (1 < sVar2) {
    lineOfChars::lineOfChars((lineOfChars *)((long)&it._M_current + 7),'-');
    poVar3 = Catch::operator<<(os,it._M_current._7_1_);
    std::operator<<(poVar3,'\n');
    itEnd._M_current =
         (SectionInfo *)
         std::vector<Catch::SectionInfo,_std::allocator<Catch::SectionInfo>_>::begin
                   (&(this->super_StreamingReporterBase).m_sectionStack);
    local_30 = __gnu_cxx::
               __normal_iterator<Catch::SectionInfo_*,_std::vector<Catch::SectionInfo,_std::allocator<Catch::SectionInfo>_>_>
               ::operator+((__normal_iterator<Catch::SectionInfo_*,_std::vector<Catch::SectionInfo,_std::allocator<Catch::SectionInfo>_>_>
                            *)&itEnd,1);
    __gnu_cxx::
    __normal_iterator<Catch::SectionInfo_const*,std::vector<Catch::SectionInfo,std::allocator<Catch::SectionInfo>>>
    ::__normal_iterator<Catch::SectionInfo*>
              ((__normal_iterator<Catch::SectionInfo_const*,std::vector<Catch::SectionInfo,std::allocator<Catch::SectionInfo>>>
                *)&local_28,&local_30);
    local_48._M_current =
         (SectionInfo *)
         std::vector<Catch::SectionInfo,_std::allocator<Catch::SectionInfo>_>::end
                   (&(this->super_StreamingReporterBase).m_sectionStack);
    __gnu_cxx::
    __normal_iterator<Catch::SectionInfo_const*,std::vector<Catch::SectionInfo,std::allocator<Catch::SectionInfo>>>
    ::__normal_iterator<Catch::SectionInfo*>
              ((__normal_iterator<Catch::SectionInfo_const*,std::vector<Catch::SectionInfo,std::allocator<Catch::SectionInfo>>>
                *)&local_40,&local_48);
    while( true ) {
      bVar1 = __gnu_cxx::operator!=(&local_28,&local_40);
      if (!bVar1) break;
      _string = __gnu_cxx::
                __normal_iterator<const_Catch::SectionInfo_*,_std::vector<Catch::SectionInfo,_std::allocator<Catch::SectionInfo>_>_>
                ::operator->(&local_28);
      anon_unknown_26::printHeaderString(os,&_string->name,0);
      __gnu_cxx::
      __normal_iterator<const_Catch::SectionInfo_*,_std::vector<Catch::SectionInfo,_std::allocator<Catch::SectionInfo>_>_>
      ::operator++(&local_28);
    }
    lineOfChars::lineOfChars((lineOfChars *)((long)&lineInfo.line + 7),'-');
    poVar3 = Catch::operator<<(os,lineInfo.line._7_1_);
    std::operator<<(poVar3,'\n');
  }
  pvVar4 = std::vector<Catch::SectionInfo,_std::allocator<Catch::SectionInfo>_>::front
                     (&(this->super_StreamingReporterBase).m_sectionStack);
  local_60 = (undefined1  [8])(pvVar4->lineInfo).file;
  lineInfo.file = (char *)(pvVar4->lineInfo).line;
  poVar3 = Catch::operator<<(os,(SourceLineInfo *)local_60);
  std::operator<<(poVar3,'\n');
  lineOfChars::lineOfChars(&local_61,'.');
  poVar3 = Catch::operator<<(os,local_61);
  std::operator<<(poVar3,"\n\n");
  return;
}

Assistant:

void TeamCityReporter::printSectionHeader(std::ostream& os) {
        assert(!m_sectionStack.empty());

        if (m_sectionStack.size() > 1) {
            os << lineOfChars('-') << '\n';

            std::vector<SectionInfo>::const_iterator
                it = m_sectionStack.begin() + 1, // Skip first section (test case)
                itEnd = m_sectionStack.end();
            for (; it != itEnd; ++it)
                printHeaderString(os, it->name);
            os << lineOfChars('-') << '\n';
        }

        SourceLineInfo lineInfo = m_sectionStack.front().lineInfo;

        os << lineInfo << '\n';
        os << lineOfChars('.') << "\n\n";
    }